

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void print_varr_insns(gen_ctx_t gen_ctx,char *title,VARR_bb_insn_t *bb_insns)

{
  long lVar1;
  MIR_insn_t_conflict insn;
  void *pvVar2;
  bool bVar3;
  bb_t_conflict pbVar4;
  void *__ptr;
  MIR_insn_t *ppMVar5;
  bb_insn_t pbVar6;
  gen_ctx_t gen_ctx_00;
  bb_insn_t_conflict unaff_R12;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  MIR_op_t *pMVar11;
  bb_t_conflict pbVar12;
  char *nop;
  int iStack_8c;
  ulong uStack_88;
  MIR_op_t *pMStack_80;
  bb_t_conflict pbStack_78;
  bb_insn_t pbStack_70;
  long lStack_68;
  undefined1 *puStack_60;
  VARR_bb_insn_t *pVStack_58;
  bb_insn_t_conflict pbStack_50;
  ulong uStack_48;
  gen_ctx_t pgStack_40;
  char *pcStack_38;
  
  gen_ctx_00 = (gen_ctx_t)gen_ctx->debug_file;
  fprintf((FILE *)gen_ctx_00,"%s insns:\n",title);
  if (bb_insns != (VARR_bb_insn_t *)0x0) {
    nop = "  %-5lu";
    uVar7 = 0;
    do {
      if (bb_insns->els_num <= uVar7) {
        return;
      }
      if (bb_insns->varr == (bb_insn_t_conflict *)0x0) {
        print_varr_insns_cold_1();
        pcStack_38 = "  %-5lu";
        pVStack_58 = bb_insns;
        pbStack_50 = unaff_R12;
        uStack_48 = uVar7;
        pgStack_40 = gen_ctx;
        free_fake_bb_insns(gen_ctx_00->ssa_ctx->arg_bb_insns);
        free_fake_bb_insns(gen_ctx_00->ssa_ctx->undef_insns);
        pbVar12 = (gen_ctx_00->curr_cfg->bbs).head;
        pbVar4 = pbStack_78;
        do {
          pbStack_78 = pbVar12;
          if (pbStack_78 == (bb_t_conflict)0x0) {
            pbStack_78 = pbVar4;
            for (pbVar12 = (gen_ctx_00->curr_cfg->bbs).head; pbVar12 != (bb_t_conflict)0x0;
                pbVar12 = (pbVar12->bb_link).next) {
              pbVar6 = (pbVar12->bb_insns).head;
              while (pbVar6 != (bb_insn_t)0x0) {
                ppMVar5 = &pbVar6->insn;
                pbVar6 = (pbVar6->bb_insn_link).next;
                if (*(int *)&(*ppMVar5)->field_0x18 == 0xba) {
                  gen_delete_insn(gen_ctx_00,*ppMVar5);
                }
              }
            }
            return;
          }
          pbVar6 = (pbStack_78->bb_insns).head;
LAB_00156723:
          if (pbVar6 != (bb_insn_t)0x0) {
            insn = pbVar6->insn;
            uVar8 = *(ulong *)&insn->field_0x18 >> 0x20;
            pMVar11 = insn->ops;
            puStack_60 = &insn->ops[0].field_0x8;
            lStack_68 = -uVar8;
            uVar7 = 0;
            uStack_88 = uVar8;
            pMStack_80 = pMVar11;
            pbStack_70 = pbVar6;
            do {
              bVar3 = true;
              if (uVar7 < uVar8) {
                pcVar9 = puStack_60 + uVar7 * 0x30;
                lVar1 = lStack_68 + uVar7;
                lVar10 = 0;
                do {
                  nop = (char *)(uVar7 + lVar10);
                  MIR_insn_op_mode(gen_ctx_00->ctx,insn,(size_t)nop,&iStack_8c);
                  uVar8 = uStack_88;
                  pMVar11 = pMStack_80;
                  if ((iStack_8c != 0) && (*pcVar9 != '\v')) {
                    if (*pcVar9 != '\x02') {
                      __assert_fail("op_ref->mode == MIR_OP_VAR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x4ff,
                                    "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                                   );
                    }
                    uVar7 = uVar7 + 1 + lVar10;
                    bVar3 = false;
                    goto LAB_001567f5;
                  }
                  lVar10 = lVar10 + 1;
                  pcVar9 = pcVar9 + 0x30;
                } while (lVar1 + lVar10 != 0);
                nop = (char *)(ulong)(uint)((int)uVar7 + -1 + (int)lVar10);
                uVar7 = uVar7 + lVar10;
                bVar3 = true;
              }
LAB_001567f5:
              if (bVar3) goto LAB_00156827;
              __ptr = pMVar11[(int)nop].data;
              while (__ptr != (void *)0x0) {
                pvVar2 = *(void **)((long)__ptr + 0x20);
                free(__ptr);
                __ptr = pvVar2;
              }
            } while( true );
          }
          pbVar12 = (pbStack_78->bb_link).next;
          pbVar4 = pbStack_78;
        } while( true );
      }
      unaff_R12 = bb_insns->varr[uVar7];
      if (unaff_R12 != (bb_insn_t_conflict)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)unaff_R12->index);
        gen_ctx_00 = gen_ctx;
        print_bb_insn(gen_ctx,unaff_R12,1);
      }
      uVar7 = uVar7 + 1;
    } while (bb_insns != (VARR_bb_insn_t *)0x0);
  }
  print_varr_insns_cold_2();
  return;
LAB_00156827:
  if (*(int *)&insn->field_0x1c != 0) {
    uVar7 = 0;
    do {
      pMVar11->data = (void *)0x0;
      uVar7 = uVar7 + 1;
      pMVar11 = pMVar11 + 1;
    } while (uVar7 < *(uint *)&insn->field_0x1c);
  }
  pbVar6 = (pbStack_70->bb_insn_link).next;
  goto LAB_00156723;
}

Assistant:

static void print_varr_insns (gen_ctx_t gen_ctx, const char *title, VARR (bb_insn_t) * bb_insns) {
  fprintf (debug_file, "%s insns:\n", title);
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, bb_insns); i++) {
    bb_insn_t bb_insn = VARR_GET (bb_insn_t, bb_insns, i);
    if (bb_insn == NULL) continue;
    fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
    print_bb_insn (gen_ctx, bb_insn, TRUE);
  }
}